

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_state.c
# Opt level: O2

lua_State * lj_state_new(lua_State *L)

{
  void *pvVar1;
  lua_State *L1;
  
  L1 = (lua_State *)lj_mem_newgco(L,0x70);
  L1->gct = '\x06';
  L1->dummy_ffid = '\x01';
  L1->status = '\0';
  L1->stacksize = 0;
  L1->cframe = (void *)0x0;
  (L1->stack).ptr64 = 0;
  (L1->openupval).gcptr64 = 0;
  (L1->glref).ptr64 = (L->glref).ptr64;
  (L1->env).gcptr64 = (L->env).gcptr64;
  stack_init(L1,L);
  pvVar1 = L->exdata2;
  L1->exdata = L->exdata;
  L1->exdata2 = pvVar1;
  return L1;
}

Assistant:

lua_State *lj_state_new(lua_State *L)
{
  lua_State *L1 = lj_mem_newobj(L, lua_State);
  L1->gct = ~LJ_TTHREAD;
  L1->dummy_ffid = FF_C;
  L1->status = LUA_OK;
  L1->stacksize = 0;
  setmref(L1->stack, NULL);
  L1->cframe = NULL;
  /* NOBARRIER: The lua_State is new (marked white). */
  setgcrefnull(L1->openupval);
  setmrefr(L1->glref, L->glref);
  setgcrefr(L1->env, L->env);
  stack_init(L1, L);  /* init stack */
  lj_assertL(iswhite(obj2gco(L1)), "new thread object is not white");
  L1->exdata = L->exdata;
  L1->exdata2 = L->exdata2;
  return L1;
}